

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

uint __thiscall Imath_2_5::Box<Imath_2_5::Vec3<int>_>::majorAxis(Box<Imath_2_5::Vec3<int>_> *this)

{
  ulong uVar1;
  Vec3<int> s;
  
  size((Box<Imath_2_5::Vec3<int>_> *)&s);
  uVar1 = 2;
  if (s.z <= (&s.x)[s.x < s.y]) {
    uVar1 = (ulong)(s.x < s.y);
  }
  return (uint)uVar1;
}

Assistant:

inline unsigned int
Box<Vec3<T> >::majorAxis() const
{
    unsigned int major = 0;
    Vec3<T>	 s     = size();

    if (s[1] > s[major])
        major = 1;

    if (s[2] > s[major])
        major = 2;

    return major;
}